

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

bool duckdb::StreamingWindowState::LeadLagState::ComputeDefault
               (ClientContext *context,BoundWindowExpression *wexpr,Value *result)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  type expr;
  Value dflt_value;
  LogicalType LStack_78;
  Value local_60;
  
  if ((wexpr->default_expr).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
    LogicalType::LogicalType(&LStack_78,&(wexpr->super_Expression).return_type);
    Value::Value(&local_60,&LStack_78);
    Value::operator=(result,&local_60);
    Value::~Value(&local_60);
    LogicalType::~LogicalType(&LStack_78);
    bVar1 = true;
  }
  else {
    this = &wexpr->default_expr;
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
    if ((char)iVar2 == '\0') {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this);
      iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar2 != '\0') {
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this);
        ExpressionExecutor::EvaluateScalar(&local_60,context,expr,false);
        bVar1 = Value::DefaultTryCastAs
                          (&local_60,&(wexpr->super_Expression).return_type,result,(string *)0x0,
                           false);
        Value::~Value(&local_60);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ComputeDefault(ClientContext &context, BoundWindowExpression &wexpr, Value &result) {
			if (!wexpr.default_expr) {
				result = Value(wexpr.return_type);
				return true;
			}

			if (wexpr.default_expr && (wexpr.default_expr->HasParameter() || !wexpr.default_expr->IsFoldable())) {
				return false;
			}
			auto dflt_value = ExpressionExecutor::EvaluateScalar(context, *wexpr.default_expr);
			return dflt_value.DefaultTryCastAs(wexpr.return_type, result, nullptr, false);
		}